

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

uint __thiscall sjtu::TrainManager::bitset_newblock(TrainManager *this,uint y)

{
  ulong uVar1;
  int i;
  uint uVar2;
  uint bit;
  ulong local_238;
  ofstream bitset;
  
  std::ofstream::ofstream(&bitset,"Bitset.dat",_S_out|_S_app);
  local_238 = std::ostream::tellp();
  for (uVar2 = 0; uVar2 != 0x200; uVar2 = uVar2 + 1) {
    bit = (uint)(y >> 5 == uVar2) << ((byte)y & 0x1f);
    std::ostream::write((char *)&bitset,(long)&bit);
  }
  uVar1 = local_238 >> 0xb;
  std::ofstream::~ofstream(&bitset);
  return (uint)uVar1;
}

Assistant:

unsigned int bitset_newblock(unsigned int y)
		{
			std::ofstream bitset("Bitset.dat" , std::ios_base::out | std::ios_base::app);
			unsigned int ret = bitset.tellp() / sizeof (unsigned int) / WS;
			for (int i = 0;i < WS;++ i)
			{
				unsigned int bit = (i == y / W) << y % W;
				bitset.write(reinterpret_cast<char *> (&bit) , sizeof (unsigned int));
			}
			return ret;
		}